

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O3

size_t plot::utf8_string_width<char_const*>(char *first,char *last)

{
  byte bVar1;
  size_t sVar2;
  uint uVar3;
  byte *pbVar4;
  uint uVar5;
  long lVar6;
  uint *puVar7;
  
  if (first == last) {
    return 0;
  }
  sVar2 = 0;
  do {
    bVar1 = *first;
    if ((char)bVar1 < '\0') {
      lVar6 = 2;
      if (((bVar1 & 0xe0) != 0xc0) && (lVar6 = 3, (bVar1 & 0xf0) != 0xe0)) {
        uVar5 = 0xffffffff;
        lVar6 = 4;
        if ((bVar1 & 0xf8) != 0xf0) goto LAB_00108c15;
      }
      uVar3 = (uint)lVar6;
      uVar5 = (uint)(*(byte *)((long)&detail::utf8_start_masks + lVar6) & bVar1);
      if (1 < (int)(uVar3 - 1)) {
        do {
          uVar5 = uVar5 << 6;
          uVar3 = uVar3 - 1;
        } while (2 < uVar3);
      }
    }
    else {
      uVar5 = (uint)bVar1;
    }
LAB_00108c15:
    puVar7 = &detail::unicode_tables<void>::zero_width;
    do {
      if ((puVar7[1] <= uVar5) && (uVar5 <= puVar7[2])) {
        lVar6 = 0;
        goto LAB_00108c6a;
      }
      puVar7 = *(uint **)(puVar7 + (ulong)(*puVar7 <= uVar5) * 2 + 4);
    } while (puVar7 != (uint *)0x0);
    puVar7 = &detail::unicode_tables<void>::double_width;
    do {
      if ((puVar7[1] <= uVar5) && (uVar5 <= puVar7[2])) {
        lVar6 = 2;
        goto LAB_00108c6a;
      }
      puVar7 = *(uint **)(puVar7 + (ulong)(*puVar7 <= uVar5) * 2 + 4);
    } while (puVar7 != (uint *)0x0);
    lVar6 = 1;
LAB_00108c6a:
    sVar2 = sVar2 + lVar6;
    pbVar4 = (byte *)first;
    while (first = last, pbVar4 != (byte *)last) {
      bVar1 = pbVar4[1];
      first = (char *)(pbVar4 + 1);
      if (((((bVar1 & 0xf8) == 0xf0) || ((bVar1 & 0xf0) == 0xe0)) || (-1 < (char)bVar1)) ||
         (pbVar4 = (byte *)first, (bVar1 & 0xe0) == 0xc0)) break;
    }
    if (first == last) {
      return sVar2;
    }
  } while( true );
}

Assistant:

std::size_t utf8_string_width(Iterator first, Iterator last) {
    std::size_t width = 0;

    for (; first != last; first = detail::utf8_next(first, last))
        width += detail::wcwidth(detail::utf8_cp(first, last));

    return width;
}